

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O2

void __thiscall
TasGrid::GridFourier::evaluateHierarchicalFunctionsInternalGPU<double>
          (GridFourier *this,double *gpu_x,int num_x,GpuVector<double> *wreal,
          GpuVector<double> *wimag)

{
  CudaFourierData<double> *pCVar1;
  size_t sVar2;
  
  sVar2 = (long)num_x * (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  if (wreal->num_entries != sVar2) {
    GpuVector<double>::resize(wreal,(this->super_BaseCanonicalGrid).acceleration,sVar2);
  }
  if (wimag->num_entries != sVar2) {
    GpuVector<double>::resize(wimag,(this->super_BaseCanonicalGrid).acceleration,sVar2);
  }
  loadGpuNodes<double>(this);
  pCVar1 = (this->gpu_cache)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaFourierData<double>_*,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
           .super__Head_base<0UL,_TasGrid::CudaFourierData<double>_*,_false>._M_head_impl;
  TasGpu::devalfor<double>
            ((this->super_BaseCanonicalGrid).acceleration,
             (this->super_BaseCanonicalGrid).num_dimensions,num_x,&this->max_levels,gpu_x,
             &pCVar1->num_nodes,&pCVar1->points,wreal->gpu_data,wimag->gpu_data);
  return;
}

Assistant:

void GridFourier::evaluateHierarchicalFunctionsInternalGPU(const T gpu_x[], int num_x, GpuVector<T> &wreal, GpuVector<T> &wimag) const{
    size_t num_weights = ((size_t) points.getNumIndexes()) * ((size_t) num_x);
    if (wreal.size() != num_weights) wreal.resize(acceleration, num_weights);
    if (wimag.size() != num_weights) wimag.resize(acceleration, num_weights);
    loadGpuNodes<T>();
    auto& ccache = getGpuCache<T>();
    TasGpu::devalfor(acceleration, num_dimensions, num_x, max_levels, gpu_x, ccache->num_nodes, ccache->points, wreal.data(), wimag.data());
}